

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void onConnect(int fd)

{
  ulong uVar1;
  size_type sVar2;
  reference ppTVar3;
  Codecc *this;
  element_type *peVar4;
  element_type *peVar5;
  uint32_t local_11c;
  undefined1 local_118 [4];
  int len;
  Ptr sendMsg;
  undefined1 local_100 [8];
  string msg;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)> local_d0;
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  local_b0;
  any local_90;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  undefined1 local_60 [16];
  undefined1 local_50 [40];
  Codecc *code;
  Ptr sc;
  ThreadPool *t;
  int fd_local;
  
  t._4_4_ = fd;
  printf("onConnect %d\n",(ulong)(uint)fd);
  uVar1 = (ulong)t._4_4_;
  sVar2 = std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::size(&pools);
  ppTVar3 = std::vector<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>::operator[]
                      (&pools,uVar1 % sVar2);
  sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*ppTVar3;
  hwnet::TCPSocket::New
            ((TCPSocket *)&code,&poller_,
             (ThreadPool *)
             sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             t._4_4_);
  this = (Codecc *)operator_new(0x28);
  Codecc::Codecc(this,(long)packetSize);
  local_50._32_8_ = this;
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&code);
  hwnet::any::any<Codecc*>(&local_90,(Codecc **)(local_50 + 0x20));
  hwnet::TCPSocket::SetUserData((TCPSocket *)local_80,(any *)peVar4);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_80);
  std::
  function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
  ::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,std::shared_ptr<hwnet::Buffer>const&,unsigned_long)>
              *)&local_b0,onDataClient);
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_70,(RecvCallback *)peVar4);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_70);
  std::function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)>::
  function<void(&)(std::shared_ptr<hwnet::TCPSocket>const&,int),void>
            ((function<void(std::shared_ptr<hwnet::TCPSocket>const&,int)> *)&local_d0,onError);
  hwnet::TCPSocket::SetErrorCallback((TCPSocket *)local_60,(ErrorCallback *)peVar4);
  std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_60);
  hwnet::TCPSocket::Start((TCPSocket *)local_50);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  Codecc::GetRecvBuffer((Codecc *)((long)&msg.field_2 + 8));
  hwnet::TCPSocket::Recv(peVar4,(Ptr *)((long)&msg.field_2 + 8));
  std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)((long)&msg.field_2 + 8))
  ;
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_50);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_60);
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>::~function(&local_d0);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_70);
  std::
  function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
  ::~function(&local_b0);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_80);
  hwnet::any::~any(&local_90);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_100,"hello",
             (allocator<char> *)
             ((long)&sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  hwnet::Buffer::New((size_t)local_118,0xd);
  local_11c = 9;
  local_11c = htonl(9);
  peVar5 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_118);
  hwnet::Buffer::Append(peVar5,(char *)&local_11c,4);
  peVar5 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_118);
  hwnet::Buffer::Append(peVar5,(char *)((long)&t + 4),4);
  peVar5 = std::__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_118);
  hwnet::Buffer::Append(peVar5,(string *)local_100);
  peVar4 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&code);
  hwnet::TCPSocket::Send(peVar4,(Ptr *)local_118,0);
  std::__atomic_base<int>::operator++(&ccount.super___atomic_base<int>,0);
  std::shared_ptr<hwnet::Buffer>::~shared_ptr((shared_ptr<hwnet::Buffer> *)local_118);
  std::__cxx11::string::~string((string *)local_100);
  std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)&code);
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect %d\n",fd);
	ThreadPool *t = pools[fd%pools.size()];
	auto sc = TCPSocket::New(&poller_,t,fd);
	auto code = new Codecc(packetSize);
	sc->SetUserData(code)->SetRecvCallback(onDataClient)->SetErrorCallback(onError)->Start()->Recv(code->GetRecvBuffer());
	
	std::string msg = std::string("hello");
	auto sendMsg = Buffer::New(5+4+4);
	int len = 5 + 4;
	len = htonl(len);
	sendMsg->Append((const char *)&len,4);
	sendMsg->Append((const char *)&fd,4);	
	sendMsg->Append(msg);
	sc->Send(sendMsg);
	ccount++;
	
}